

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_operators.hpp
# Opt level: O3

void duckdb::FloatingPointOperator::HandleStats<duckdb::double_na_equal,double>
               (ColumnWriterStatistics *stats,double target_value)

{
  bool bVar1;
  ColumnWriterStatistics local_18;
  
  local_18._vptr_ColumnWriterStatistics = (_func_int **)target_value;
  bVar1 = Value::IsNan<double>(target_value);
  if (bVar1) {
    *(undefined1 *)&stats[3]._vptr_ColumnWriterStatistics = 1;
  }
  else {
    bVar1 = GreaterThan::Operation<double>((double *)(stats + 1),(double *)&local_18);
    if (bVar1) {
      stats[1]._vptr_ColumnWriterStatistics = local_18._vptr_ColumnWriterStatistics;
    }
    bVar1 = GreaterThan::Operation<double>((double *)&local_18,(double *)(stats + 2));
    if (bVar1) {
      stats[2]._vptr_ColumnWriterStatistics = local_18._vptr_ColumnWriterStatistics;
    }
  }
  return;
}

Assistant:

static void HandleStats(ColumnWriterStatistics *stats, TGT target_value) {
		auto &numeric_stats = stats->Cast<FloatingPointStatisticsState<SRC, TGT, BaseParquetOperator>>();
		if (Value::IsNan(target_value)) {
			numeric_stats.has_nan = true;
		} else {
			if (LessThan::Operation(target_value, numeric_stats.min)) {
				numeric_stats.min = target_value;
			}
			if (GreaterThan::Operation(target_value, numeric_stats.max)) {
				numeric_stats.max = target_value;
			}
		}
	}